

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFileListGeneratorMacProject::~cmFileListGeneratorMacProject(cmFileListGeneratorMacProject *this)

{
  cmFileListGeneratorMacProject *this_local;
  
  ~cmFileListGeneratorMacProject(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

cmFileListGeneratorMacProject(std::vector<std::string> const& names,
                                const char* ext)
    : cmFileListGeneratorBase()
    , Names(names)
    , Extension(ext)
  {
  }